

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_mainwindow.h
# Opt level: O0

void __thiscall Ui_MainWindow::setupUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  QRect *pQVar1;
  QMainWindow *pQVar2;
  bool bVar3;
  QWidget *pQVar4;
  QMenuBar *pQVar5;
  QStatusBar *pQVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView local_f8;
  QString local_e8;
  QRect local_d0;
  QByteArrayView local_c0;
  QString local_b0;
  QByteArrayView local_98;
  QString local_88;
  QFlags<Qt::WindowType> local_6c;
  QByteArrayView local_68;
  QString local_58;
  QString local_30;
  QMainWindow *local_18;
  QMainWindow *MainWindow_local;
  Ui_MainWindow *this_local;
  
  local_18 = MainWindow;
  MainWindow_local = (QMainWindow *)this;
  QObject::objectName();
  bVar3 = QString::isEmpty(&local_30);
  QString::~QString(&local_30);
  pQVar2 = local_18;
  if (bVar3) {
    QByteArrayView::QByteArrayView<11ul>(&local_68,(char (*) [11])"MainWindow");
    QVar7.m_data = (storage_type *)local_68.m_size;
    QVar7.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar7);
    QObject::setObjectName((QString *)pQVar2);
    QString::~QString(&local_58);
  }
  QWidget::resize((QWidget *)local_18,800,600);
  pQVar4 = (QWidget *)operator_new(0x28);
  pQVar2 = local_18;
  QFlags<Qt::WindowType>::QFlags(&local_6c);
  QWidget::QWidget(pQVar4,(QWidget *)pQVar2,(QFlags *)(ulong)local_6c.i);
  this->centralwidget = pQVar4;
  pQVar4 = this->centralwidget;
  QByteArrayView::QByteArrayView<14ul>(&local_98,(char (*) [14])"centralwidget");
  QVar8.m_data = (storage_type *)local_98.m_size;
  QVar8.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_88);
  QMainWindow::setCentralWidget((QWidget *)local_18);
  pQVar5 = (QMenuBar *)operator_new(0x28);
  QMenuBar::QMenuBar(pQVar5,(QWidget *)local_18);
  this->menubar = pQVar5;
  pQVar5 = this->menubar;
  QByteArrayView::QByteArrayView<8ul>(&local_c0,(char (*) [8])"menubar");
  QVar9.m_data = (storage_type *)local_c0.m_size;
  QVar9.m_size = (qsizetype)&local_b0;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_b0);
  pQVar1 = (QRect *)this->menubar;
  QRect::QRect(&local_d0,0,0,800,0xf);
  QWidget::setGeometry(pQVar1);
  QMainWindow::setMenuBar((QMenuBar *)local_18);
  pQVar6 = (QStatusBar *)operator_new(0x28);
  QStatusBar::QStatusBar(pQVar6,(QWidget *)local_18);
  this->statusbar = pQVar6;
  pQVar6 = this->statusbar;
  QByteArrayView::QByteArrayView<10ul>(&local_f8,(char (*) [10])"statusbar");
  QVar10.m_data = (storage_type *)local_f8.m_size;
  QVar10.m_size = (qsizetype)&local_e8;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)pQVar6);
  QString::~QString(&local_e8);
  QMainWindow::setStatusBar((QStatusBar *)local_18);
  retranslateUi(this,local_18);
  QMetaObject::connectSlotsByName((QObject *)local_18);
  return;
}

Assistant:

void setupUi(QMainWindow *MainWindow)
    {
        if (MainWindow->objectName().isEmpty())
            MainWindow->setObjectName(QString::fromUtf8("MainWindow"));
        MainWindow->resize(800, 600);
        centralwidget = new QWidget(MainWindow);
        centralwidget->setObjectName(QString::fromUtf8("centralwidget"));
        MainWindow->setCentralWidget(centralwidget);
        menubar = new QMenuBar(MainWindow);
        menubar->setObjectName(QString::fromUtf8("menubar"));
        menubar->setGeometry(QRect(0, 0, 800, 15));
        MainWindow->setMenuBar(menubar);
        statusbar = new QStatusBar(MainWindow);
        statusbar->setObjectName(QString::fromUtf8("statusbar"));
        MainWindow->setStatusBar(statusbar);

        retranslateUi(MainWindow);

        QMetaObject::connectSlotsByName(MainWindow);
    }